

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stackFrame.c
# Opt level: O2

void sysbvm_stackFrame_returnValueInto(sysbvm_tuple_t value,sysbvm_stackFrameRecord_t *targetRecord)

{
  _Bool _Var1;
  long in_FS_OFFSET;
  
  _Var1 = sysbvm_stackFrame_isValidRecordInThisContext(targetRecord);
  if ((!_Var1) || (targetRecord->type != SYSBVM_STACK_FRAME_RECORD_TYPE_FUNCTION_ACTIVATION)) {
    sysbvm_error("Cannot unwind for return into invalid target.");
  }
  sysbvm_stackFrame_prepareUnwindingUntil(targetRecord);
  *(sysbvm_tuple_t *)&targetRecord[2].type = value;
  *(sysbvm_stackFrameRecord_t **)(in_FS_OFFSET + -0x10) = targetRecord;
  longjmp((__jmp_buf_tag *)(targetRecord + 3),1);
}

Assistant:

SYSBVM_API void sysbvm_stackFrame_returnValueInto(sysbvm_tuple_t value, sysbvm_stackFrameRecord_t *targetRecord)
{
    if(!sysbvm_stackFrame_isValidRecordInThisContext(targetRecord)
        || targetRecord->type != SYSBVM_STACK_FRAME_RECORD_TYPE_FUNCTION_ACTIVATION)
        sysbvm_error("Cannot unwind for return into invalid target.");

    sysbvm_stackFrame_prepareUnwindingUntil(targetRecord);
    sysbvm_stackFrameFunctionActivationRecord_t *activationRecord = (sysbvm_stackFrameFunctionActivationRecord_t*)targetRecord;
    activationRecord->result = value;
    sysbvm_stackFrame_activeRecord = targetRecord;
    longjmp(activationRecord->jmpbuffer, 1);
}